

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall
ncnn::Net::forward_layer
          (Net *this,int layer_index,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  Mat *pMVar1;
  undefined8 *puVar2;
  int *piVar3;
  pointer pMVar4;
  long *plVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  void *pvVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  pointer pMVar15;
  int *piVar16;
  pointer piVar17;
  pointer piVar18;
  Option *__arg;
  ulong uVar19;
  long lVar20;
  Layer *pLVar21;
  bool bVar22;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  Mat m;
  Mat local_d8;
  allocator_type local_89;
  Mat local_88;
  Layer *local_40;
  Net *local_38;
  
  pLVar21 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
            .super__Vector_impl_data._M_start[layer_index];
  local_40 = pLVar21;
  local_38 = this;
  if (pLVar21->one_blob_only == true) {
    iVar14 = *(pLVar21->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar12 = *(pLVar21->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar15 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (pMVar15[iVar14].dims == 0) {
      iVar13 = forward_layer(this,(this->blobs).
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar14].producer,
                             blob_mats,opt);
      if (iVar13 != 0) {
        return iVar13;
      }
      pMVar15 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    pLVar21 = local_40;
    local_d8.data = pMVar15[iVar14].data;
    piVar16 = pMVar15[iVar14].refcount;
    local_d8.refcount._0_4_ = SUB84(piVar16,0);
    local_d8.refcount._4_4_ = (undefined4)((ulong)piVar16 >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)pMVar15[iVar14].elemsize;
    local_d8.elemsize._4_4_ = (undefined4)(pMVar15[iVar14].elemsize >> 0x20);
    local_d8.elempack = pMVar15[iVar14].elempack;
    local_d8.allocator = pMVar15[iVar14].allocator;
    pMVar4 = pMVar15 + iVar14;
    local_d8.dims = pMVar4->dims;
    local_d8.w = pMVar4->w;
    local_d8._48_8_ = *(undefined8 *)(&pMVar4->dims + 2);
    local_d8.cstep = pMVar15[iVar14].cstep;
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + 1;
      UNLOCK();
    }
    if (opt->lightmode == true) {
      pMVar4 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pMVar15 = pMVar4 + iVar14;
      piVar16 = pMVar4[iVar14].refcount;
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (pMVar15->allocator == (Allocator *)0x0) {
            if (pMVar15->data != (void *)0x0) {
              free(pMVar15->data);
            }
          }
          else {
            (*pMVar15->allocator->_vptr_Allocator[3])();
          }
        }
      }
      *(undefined8 *)((long)&pMVar15->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar15->elemsize + 4) = 0;
      pMVar15->data = (void *)0x0;
      pMVar15->refcount = (int *)0x0;
      pMVar15->dims = 0;
      pMVar15->w = 0;
      pMVar15->h = 0;
      pMVar15->c = 0;
      pMVar15->cstep = 0;
      if ((pLVar21->support_inplace == true) &&
         (*(int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_) != 1)) {
        if ((local_d8.data == (void *)0x0) || (local_d8.cstep * (long)local_d8.c == 0)) {
          local_88.elemsize._0_4_ = 0;
          local_88.elemsize._4_4_ = 0;
          local_88.elempack = 0;
          local_88.data = (void *)0x0;
          local_88.refcount._0_4_ = 0;
          local_88.refcount._4_4_ = 0;
          local_88.allocator = (Allocator *)0x0;
          local_88.dims = 0;
          local_88.w = 0;
          local_88.h = 0;
          local_88.c = 0;
          local_88.cstep = 0;
        }
        else {
          local_88.elemsize._0_4_ = 0;
          local_88.elemsize._4_4_ = 0;
          local_88.elempack = 0;
          local_88.data = (void *)0x0;
          local_88.refcount._0_4_ = 0;
          local_88.refcount._4_4_ = 0;
          local_88.allocator = (Allocator *)0x0;
          local_88.dims = 0;
          local_88.w = 0;
          local_88.h = 0;
          local_88.c = 0;
          local_88.cstep = 0;
          if (local_d8.dims == 3) {
            Mat::create(&local_88,local_d8.w,local_d8.h,local_d8.c,
                        CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize),
                        local_d8.elempack,(Allocator *)0x0);
          }
          else if (local_d8.dims == 2) {
            Mat::create(&local_88,local_d8.w,local_d8.h,
                        CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize),
                        local_d8.elempack,(Allocator *)0x0);
          }
          else if (local_d8.dims == 1) {
            Mat::create(&local_88,local_d8.w,
                        CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize),
                        local_d8.elempack,(Allocator *)0x0);
          }
          if ((long)local_d8.c * local_d8.cstep != 0) {
            memcpy(local_88.data,local_d8.data,
                   (long)local_d8.c * local_d8.cstep *
                   CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize));
          }
        }
        piVar16 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        piVar16 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (local_d8.allocator == (Allocator *)0x0) {
              if (local_d8.data != (void *)0x0) {
                free(local_d8.data);
              }
            }
            else {
              (*(local_d8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar16 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        local_d8.data = local_88.data;
        local_d8.refcount._0_4_ = local_88.refcount._0_4_;
        local_d8.refcount._4_4_ = local_88.refcount._4_4_;
        local_d8.elemsize._0_4_ = (undefined4)local_88.elemsize;
        local_d8.elemsize._4_4_ = local_88.elemsize._4_4_;
        local_d8.elempack = local_88.elempack;
        local_d8.allocator = local_88.allocator;
        uVar7._0_4_ = local_88.dims;
        uVar7._4_4_ = local_88.w;
        local_d8.dims = local_88.dims;
        local_d8.w = local_88.w;
        uVar8._0_4_ = local_88.h;
        uVar8._4_4_ = local_88.c;
        local_d8.h = local_88.h;
        local_d8.c = local_88.c;
        local_d8.cstep = local_88.cstep;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (local_88.allocator == (Allocator *)0x0) {
              if (local_88.data != (void *)0x0) {
                local_d8._40_8_ = uVar7;
                local_d8._48_8_ = uVar8;
                free(local_88.data);
              }
            }
            else {
              local_d8._40_8_ = uVar7;
              local_d8._48_8_ = uVar8;
              (*(local_88.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
    uVar7 = local_d8._40_8_;
    uVar8 = local_d8._48_8_;
    if (opt->use_packing_layout == true) {
      local_88.elemsize._0_4_ = 0;
      local_88.elemsize._4_4_ = 0;
      local_88.elempack = 0;
      local_88.data = (void *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.allocator = (Allocator *)0x0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.c = 0;
      local_88.cstep = 0;
      convert_packing(&local_d8,&local_88,
                      (uint)pLVar21->support_packing + (uint)pLVar21->support_packing * 2 + 1,opt);
      piVar16 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + 1;
        UNLOCK();
      }
      piVar16 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_d8.allocator == (Allocator *)0x0) {
            if (local_d8.data != (void *)0x0) {
              free(local_d8.data);
            }
          }
          else {
            (*(local_d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar16 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      local_d8.data = local_88.data;
      local_d8.refcount._0_4_ = local_88.refcount._0_4_;
      local_d8.refcount._4_4_ = local_88.refcount._4_4_;
      local_d8.elemsize._0_4_ = (undefined4)local_88.elemsize;
      local_d8.elemsize._4_4_ = local_88.elemsize._4_4_;
      local_d8.elempack = local_88.elempack;
      local_d8.allocator = local_88.allocator;
      uVar9._0_4_ = local_88.dims;
      uVar9._4_4_ = local_88.w;
      local_d8.dims = local_88.dims;
      local_d8.w = local_88.w;
      uVar10._0_4_ = local_88.h;
      uVar10._4_4_ = local_88.c;
      local_d8.h = local_88.h;
      local_d8.c = local_88.c;
      local_d8.cstep = local_88.cstep;
      uVar7 = uVar9;
      uVar8 = uVar10;
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        uVar7 = local_d8._40_8_;
        uVar8 = local_d8._48_8_;
        if (*piVar16 == 0) {
          if (local_88.allocator == (Allocator *)0x0) {
            if (local_88.data != (void *)0x0) {
              local_d8._40_8_ = uVar9;
              local_d8._48_8_ = uVar10;
              free(local_88.data);
              uVar7 = local_d8._40_8_;
              uVar8 = local_d8._48_8_;
            }
          }
          else {
            local_d8._40_8_ = uVar9;
            local_d8._48_8_ = uVar10;
            (*(local_88.allocator)->_vptr_Allocator[3])();
            uVar7 = local_d8._40_8_;
            uVar8 = local_d8._48_8_;
          }
        }
      }
    }
    local_d8._48_8_ = uVar8;
    local_d8._40_8_ = uVar7;
    if ((opt->lightmode == true) && (pLVar21->support_inplace == true)) {
      iVar13 = (*pLVar21->_vptr_Layer[9])(pLVar21,&local_d8,opt);
      iVar14 = 0;
      if (iVar13 == 0) {
        pMVar15 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start + iVar12;
        bVar22 = true;
        if (pMVar15 != &local_d8) {
          piVar16 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + 1;
            UNLOCK();
          }
          piVar16 = pMVar15->refcount;
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (pMVar15->allocator == (Allocator *)0x0) {
                if (pMVar15->data != (void *)0x0) {
                  free(pMVar15->data);
                }
              }
              else {
                (*pMVar15->allocator->_vptr_Allocator[3])();
              }
            }
          }
          *(undefined8 *)((long)&pMVar15->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar15->elemsize + 4) = 0;
          pMVar15->data = (void *)0x0;
          pMVar15->refcount = (int *)0x0;
          pMVar15->dims = 0;
          pMVar15->w = 0;
          pMVar15->h = 0;
          pMVar15->c = 0;
          pMVar15->cstep = 0;
          pMVar15->data = local_d8.data;
          pMVar15->refcount = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
          pMVar15->elemsize = CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
          pMVar15->elempack = local_d8.elempack;
          pMVar15->allocator = local_d8.allocator;
          pMVar15->dims = local_d8.dims;
          pMVar15->w = local_d8.w;
          pMVar15->h = local_d8.h;
          pMVar15->c = local_d8.c;
          pMVar15->cstep = local_d8.cstep;
        }
      }
      else {
        bVar22 = false;
        iVar14 = iVar13;
      }
    }
    else {
      local_88.elemsize._0_4_ = 0;
      local_88.elemsize._4_4_ = 0;
      local_88.elempack = 0;
      local_88.data = (void *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.allocator = (Allocator *)0x0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.c = 0;
      local_88.cstep = 0;
      iVar14 = (*pLVar21->_vptr_Layer[7])(pLVar21,&local_d8,&local_88,opt);
      bVar22 = iVar14 == 0;
      if ((bVar22) &&
         (pMVar15 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start + iVar12, pMVar15 != &local_88)) {
        piVar16 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        piVar16 = pMVar15->refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (pMVar15->allocator == (Allocator *)0x0) {
              if (pMVar15->data != (void *)0x0) {
                free(pMVar15->data);
              }
            }
            else {
              (*pMVar15->allocator->_vptr_Allocator[3])();
            }
          }
        }
        *(undefined8 *)((long)&pMVar15->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar15->elemsize + 4) = 0;
        pMVar15->data = (void *)0x0;
        pMVar15->refcount = (int *)0x0;
        pMVar15->dims = 0;
        pMVar15->w = 0;
        pMVar15->h = 0;
        pMVar15->c = 0;
        pMVar15->cstep = 0;
        pMVar15->data = local_88.data;
        pMVar15->refcount = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        pMVar15->elemsize = CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
        pMVar15->elempack = local_88.elempack;
        pMVar15->allocator = local_88.allocator;
        pMVar15->dims = local_88.dims;
        pMVar15->w = local_88.w;
        pMVar15->h = local_88.h;
        pMVar15->c = local_88.c;
        pMVar15->cstep = local_88.cstep;
      }
      piVar16 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_88.allocator == (Allocator *)0x0) {
            if (local_88.data != (void *)0x0) {
              free(local_88.data);
            }
          }
          else {
            (*(local_88.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar16 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (!bVar22) {
      return iVar14;
    }
  }
  else {
    __arg = opt;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_88,
               (long)(pLVar21->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               *(long *)&(pLVar21->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data >> 2,(allocator_type *)&local_d8);
    piVar17 = (pLVar21->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((pLVar21->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar17) {
      lVar20 = 0;
      uVar19 = 0;
      do {
        iVar14 = piVar17[uVar19];
        pMVar15 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (pMVar15[iVar14].dims == 0) {
          iVar12 = forward_layer(local_38,(local_38->blobs).
                                          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                                          ._M_impl.super__Vector_impl_data._M_start[iVar14].producer
                                 ,blob_mats,opt);
          if (iVar12 != 0) goto LAB_0011575b;
          pMVar15 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        }
        pvVar11 = local_88.data;
        pMVar15 = pMVar15 + iVar14;
        pMVar4 = (pointer)((long)local_88.data + lVar20);
        if (pMVar4 != pMVar15) {
          piVar16 = pMVar15->refcount;
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + 1;
            UNLOCK();
          }
          piVar16 = *(int **)((long)local_88.data + lVar20 + 8);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              plVar5 = *(long **)((long)local_88.data + lVar20 + 0x20);
              if (plVar5 == (long *)0x0) {
                if (*(void **)((long)local_88.data + lVar20) != (void *)0x0) {
                  free(*(void **)((long)local_88.data + lVar20));
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&pMVar4->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar4->elemsize + 4) = 0;
          pMVar4->data = (void *)0x0;
          pMVar4->refcount = (int *)0x0;
          puVar2 = (undefined8 *)((long)pvVar11 + lVar20 + 0x28);
          *puVar2 = 0;
          puVar2[1] = 0;
          *(undefined8 *)((long)pvVar11 + lVar20 + 0x38) = 0;
          piVar16 = pMVar15->refcount;
          *(undefined8 *)((long)pvVar11 + lVar20) = pMVar15->data;
          ((undefined8 *)((long)pvVar11 + lVar20))[1] = piVar16;
          *(size_t *)((long)pvVar11 + lVar20 + 0x10) = pMVar15->elemsize;
          *(int *)((long)pvVar11 + lVar20 + 0x18) = pMVar15->elempack;
          *(Allocator **)((long)pvVar11 + lVar20 + 0x20) = pMVar15->allocator;
          iVar12 = pMVar15->w;
          iVar13 = pMVar15->h;
          iVar6 = pMVar15->c;
          piVar16 = (int *)((long)pvVar11 + lVar20 + 0x28);
          *piVar16 = pMVar15->dims;
          piVar16[1] = iVar12;
          piVar16[2] = iVar13;
          piVar16[3] = iVar6;
          *(size_t *)((long)pvVar11 + lVar20 + 0x38) = pMVar15->cstep;
        }
        pLVar21 = local_40;
        if (opt->lightmode == true) {
          pMVar4 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pMVar15 = pMVar4 + iVar14;
          piVar16 = pMVar4[iVar14].refcount;
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (pMVar15->allocator == (Allocator *)0x0) {
                if (pMVar15->data != (void *)0x0) {
                  free(pMVar15->data);
                }
              }
              else {
                (*pMVar15->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pLVar21 = local_40;
          *(undefined8 *)((long)&pMVar15->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar15->elemsize + 4) = 0;
          pMVar15->data = (void *)0x0;
          pMVar15->refcount = (int *)0x0;
          pMVar15->dims = 0;
          pMVar15->w = 0;
          pMVar15->h = 0;
          pMVar15->c = 0;
          pMVar15->cstep = 0;
          if ((local_40->support_inplace == true) &&
             (**(int **)((long)local_88.data + lVar20 + 8) != 1)) {
            Mat::clone(&local_d8,(__fn *)((long)local_88.data + lVar20),(void *)0x0,(int)opt,__arg);
            pvVar11 = local_88.data;
            pMVar1 = (Mat *)((long)local_88.data + lVar20);
            piVar16 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
            if (pMVar1 != &local_d8) {
              if (piVar16 != (int *)0x0) {
                LOCK();
                *piVar16 = *piVar16 + 1;
                UNLOCK();
              }
              piVar16 = *(int **)((long)local_88.data + lVar20 + 8);
              if (piVar16 != (int *)0x0) {
                LOCK();
                *piVar16 = *piVar16 + -1;
                UNLOCK();
                if (*piVar16 == 0) {
                  plVar5 = *(long **)((long)local_88.data + lVar20 + 0x20);
                  if (plVar5 == (long *)0x0) {
                    if (*(void **)((long)local_88.data + lVar20) != (void *)0x0) {
                      free(*(void **)((long)local_88.data + lVar20));
                    }
                  }
                  else {
                    (**(code **)(*plVar5 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
              pMVar1->data = (void *)0x0;
              pMVar1->refcount = (int *)0x0;
              puVar2 = (undefined8 *)((long)pvVar11 + lVar20 + 0x28);
              *puVar2 = 0;
              puVar2[1] = 0;
              *(undefined8 *)((long)pvVar11 + lVar20 + 0x38) = 0;
              *(void **)((long)pvVar11 + lVar20) = local_d8.data;
              piVar16 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
              *(int **)((long)pvVar11 + lVar20 + 8) = piVar16;
              *(ulong *)((long)pvVar11 + lVar20 + 0x10) =
                   CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
              *(int *)((long)pvVar11 + lVar20 + 0x18) = local_d8.elempack;
              *(Allocator **)((long)pvVar11 + lVar20 + 0x20) = local_d8.allocator;
              piVar3 = (int *)((long)pvVar11 + lVar20 + 0x28);
              *piVar3 = local_d8.dims;
              piVar3[1] = local_d8.w;
              piVar3[2] = local_d8.h;
              piVar3[3] = local_d8.c;
              *(size_t *)((long)pvVar11 + lVar20 + 0x38) = local_d8.cstep;
            }
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                if (local_d8.allocator == (Allocator *)0x0) {
                  if (local_d8.data != (void *)0x0) {
                    free(local_d8.data);
                  }
                }
                else {
                  (*(local_d8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
        }
        if (opt->use_packing_layout == true) {
          local_d8.elemsize._0_4_ = 0;
          local_d8.elemsize._4_4_ = 0;
          local_d8.elempack = 0;
          local_d8.data = (void *)0x0;
          local_d8.refcount._0_4_ = 0;
          local_d8.refcount._4_4_ = 0;
          local_d8.h = 0;
          local_d8.c = 0;
          local_d8.cstep = 0;
          local_d8.allocator = (Allocator *)0x0;
          local_d8.dims = 0;
          local_d8.w = 0;
          convert_packing((Mat *)((long)local_88.data + lVar20),&local_d8,
                          (uint)pLVar21->support_packing + (uint)pLVar21->support_packing * 2 + 1,
                          opt);
          pvVar11 = local_88.data;
          pMVar1 = (Mat *)((long)local_88.data + lVar20);
          piVar16 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
          if (pMVar1 != &local_d8) {
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + 1;
              UNLOCK();
            }
            piVar16 = *(int **)((long)local_88.data + lVar20 + 8);
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                plVar5 = *(long **)((long)local_88.data + lVar20 + 0x20);
                if (plVar5 == (long *)0x0) {
                  if (*(void **)((long)local_88.data + lVar20) != (void *)0x0) {
                    free(*(void **)((long)local_88.data + lVar20));
                  }
                }
                else {
                  (**(code **)(*plVar5 + 0x18))();
                }
              }
            }
            *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
            pMVar1->data = (void *)0x0;
            pMVar1->refcount = (int *)0x0;
            puVar2 = (undefined8 *)((long)pvVar11 + lVar20 + 0x28);
            *puVar2 = 0;
            puVar2[1] = 0;
            *(undefined8 *)((long)pvVar11 + lVar20 + 0x38) = 0;
            *(void **)((long)pvVar11 + lVar20) = local_d8.data;
            piVar16 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
            *(int **)((long)pvVar11 + lVar20 + 8) = piVar16;
            *(ulong *)((long)pvVar11 + lVar20 + 0x10) =
                 CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
            *(int *)((long)pvVar11 + lVar20 + 0x18) = local_d8.elempack;
            *(Allocator **)((long)pvVar11 + lVar20 + 0x20) = local_d8.allocator;
            piVar3 = (int *)((long)pvVar11 + lVar20 + 0x28);
            *piVar3 = local_d8.dims;
            piVar3[1] = local_d8.w;
            piVar3[2] = local_d8.h;
            piVar3[3] = local_d8.c;
            *(size_t *)((long)pvVar11 + lVar20 + 0x38) = local_d8.cstep;
          }
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (local_d8.allocator == (Allocator *)0x0) {
                if (local_d8.data != (void *)0x0) {
                  free(local_d8.data);
                }
              }
              else {
                (*(local_d8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        uVar19 = uVar19 + 1;
        piVar17 = (pLVar21->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar20 = lVar20 + 0x40;
      } while (uVar19 < (ulong)((long)(pLVar21->bottoms).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)piVar17 >> 2));
    }
    if ((opt->lightmode == true) && (pLVar21->support_inplace == true)) {
      iVar12 = (*pLVar21->_vptr_Layer[8])(pLVar21,&local_88,opt);
      pLVar21 = local_40;
      if (iVar12 != 0) {
LAB_0011575b:
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_88);
        return iVar12;
      }
      piVar17 = (local_40->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar18 = (local_40->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (piVar18 != piVar17) {
        lVar20 = 0;
        uVar19 = 0;
        do {
          pvVar11 = local_88.data;
          pMVar15 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start + piVar17[uVar19];
          if ((pointer)((long)local_88.data + lVar20) != pMVar15) {
            piVar16 = *(int **)((long)local_88.data + lVar20 + 8);
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + 1;
              UNLOCK();
            }
            piVar16 = pMVar15->refcount;
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                if (pMVar15->allocator == (Allocator *)0x0) {
                  if (pMVar15->data != (void *)0x0) {
                    free(pMVar15->data);
                  }
                }
                else {
                  (*pMVar15->allocator->_vptr_Allocator[3])();
                }
              }
            }
            *(undefined8 *)((long)&pMVar15->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar15->elemsize + 4) = 0;
            pMVar15->data = (void *)0x0;
            pMVar15->refcount = (int *)0x0;
            pMVar15->dims = 0;
            pMVar15->w = 0;
            pMVar15->h = 0;
            pMVar15->c = 0;
            pMVar15->cstep = 0;
            piVar16 = (int *)((undefined8 *)((long)pvVar11 + lVar20))[1];
            pMVar15->data = *(void **)((long)pvVar11 + lVar20);
            pMVar15->refcount = piVar16;
            pMVar15->elemsize = *(size_t *)((long)pvVar11 + lVar20 + 0x10);
            pMVar15->elempack = *(int *)((long)pvVar11 + lVar20 + 0x18);
            pMVar15->allocator = *(Allocator **)((long)pvVar11 + lVar20 + 0x20);
            puVar2 = (undefined8 *)((long)pvVar11 + lVar20 + 0x28);
            uVar7 = *puVar2;
            uVar8 = puVar2[1];
            pMVar15->dims = (int)uVar7;
            pMVar15->w = (int)((ulong)uVar7 >> 0x20);
            pMVar15->h = (int)uVar8;
            pMVar15->c = (int)((ulong)uVar8 >> 0x20);
            pMVar15->cstep = *(size_t *)((long)pvVar11 + lVar20 + 0x38);
            piVar17 = (pLVar21->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar18 = (pLVar21->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar19 = uVar19 + 1;
          lVar20 = lVar20 + 0x40;
        } while (uVar19 < (ulong)((long)piVar18 - (long)piVar17 >> 2));
      }
    }
    else {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8,
                 (long)(pLVar21->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 *(long *)&(pLVar21->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data >> 2,&local_89);
      iVar12 = (*pLVar21->_vptr_Layer[6])(pLVar21,&local_88,&local_d8,opt);
      pLVar21 = local_40;
      if (iVar12 != 0) {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8);
        goto LAB_0011575b;
      }
      piVar17 = (local_40->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar18 = (local_40->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (piVar18 != piVar17) {
        lVar20 = 0;
        uVar19 = 0;
        do {
          pvVar11 = local_d8.data;
          pMVar15 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start + piVar17[uVar19];
          if ((pointer)((long)local_d8.data + lVar20) != pMVar15) {
            piVar16 = *(int **)((long)local_d8.data + lVar20 + 8);
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + 1;
              UNLOCK();
            }
            piVar16 = pMVar15->refcount;
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                if (pMVar15->allocator == (Allocator *)0x0) {
                  if (pMVar15->data != (void *)0x0) {
                    free(pMVar15->data);
                  }
                }
                else {
                  (*pMVar15->allocator->_vptr_Allocator[3])();
                }
              }
            }
            *(undefined8 *)((long)&pMVar15->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar15->elemsize + 4) = 0;
            pMVar15->data = (void *)0x0;
            pMVar15->refcount = (int *)0x0;
            pMVar15->dims = 0;
            pMVar15->w = 0;
            pMVar15->h = 0;
            pMVar15->c = 0;
            pMVar15->cstep = 0;
            piVar16 = (int *)((undefined8 *)((long)pvVar11 + lVar20))[1];
            pMVar15->data = *(void **)((long)pvVar11 + lVar20);
            pMVar15->refcount = piVar16;
            pMVar15->elemsize = *(size_t *)((long)pvVar11 + lVar20 + 0x10);
            pMVar15->elempack = *(int *)((long)pvVar11 + lVar20 + 0x18);
            pMVar15->allocator = *(Allocator **)((long)pvVar11 + lVar20 + 0x20);
            puVar2 = (undefined8 *)((long)pvVar11 + lVar20 + 0x28);
            uVar7 = *puVar2;
            uVar8 = puVar2[1];
            pMVar15->dims = (int)uVar7;
            pMVar15->w = (int)((ulong)uVar7 >> 0x20);
            pMVar15->h = (int)uVar8;
            pMVar15->c = (int)((ulong)uVar8 >> 0x20);
            pMVar15->cstep = *(size_t *)((long)pvVar11 + lVar20 + 0x38);
            piVar17 = (pLVar21->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar18 = (pLVar21->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar19 = uVar19 + 1;
          lVar20 = lVar20 + 0x40;
        } while (uVar19 < (ulong)((long)piVar18 - (long)piVar17 >> 2));
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8);
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_88);
  }
  return 0;
}

Assistant:

int Net::forward_layer(int layer_index, std::vector<Mat>& blob_mats, Option& opt) const
{
    const Layer* layer = layers[layer_index];

//     fprintf(stderr, "forward_layer %d %s\n", layer_index, layer->name.c_str());

    if (layer->one_blob_only)
    {
        // load bottom blob
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        if (blob_mats[bottom_blob_index].dims == 0)
        {
            int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
            if (ret != 0)
                return ret;
        }

        Mat bottom_blob = blob_mats[bottom_blob_index];

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob.refcount != 1)
            {
                bottom_blob = bottom_blob.clone();
            }
        }

        if (opt.use_packing_layout)
        {
            int elempack = layer->support_packing ? 4 : 1;

            Mat bottom_blob_packed;
            convert_packing(bottom_blob, bottom_blob_packed, elempack, opt);
            bottom_blob = bottom_blob_packed;
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_top_blob, bottom_top_blob, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blob, top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_blob, top_blob, start, end);
#else
            int ret = layer->forward(bottom_blob, top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

    }
    else
    {
        // load bottom blobs
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i=0; i<layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            if (blob_mats[bottom_blob_index].dims == 0)
            {
                int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
                if (ret != 0)
                    return ret;
            }

            bottom_blobs[i] = blob_mats[bottom_blob_index];

            if (opt.lightmode)
            {
                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blobs[i].refcount != 1)
                {
                    bottom_blobs[i] = bottom_blobs[i].clone();
                }
            }

            if (opt.use_packing_layout)
            {
                int elempack = layer->support_packing ? 4 : 1;

                Mat bottom_blob_packed;
                convert_packing(bottom_blobs[i], bottom_blob_packed, elempack, opt);
                bottom_blobs[i] = bottom_blob_packed;
            }
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }
    }

//     fprintf(stderr, "forward_layer %d %s done\n", layer_index, layer->name.c_str());
//     const Mat& blob = blob_mats[layer->tops[0]];
//     fprintf(stderr, "[%-2d %-16s %-16s]  %d    blobs count = %-3d   size = %-3d x %-3d\n", layer_index, layer->type.c_str(), layer->name.c_str(), layer->tops[0], blob.c, blob.h, blob.w);

    return 0;
}